

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBar::setTabsClosable(QTabBar *this,bool closable)

{
  QTabBarPrivate *this_00;
  void **ppvVar1;
  Tab **ppTVar2;
  long lVar3;
  bool bVar4;
  ButtonPosition position;
  QStyle *pQVar5;
  QWidget *widget;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((*(ushort *)&this_00->field_0x2d0 & 0x40) == 0) == closable) {
    *(ushort *)&this_00->field_0x2d0 =
         *(ushort *)&this_00->field_0x2d0 & 0xffbf | (ushort)closable << 6;
    pQVar5 = QWidget::style(&this->super_QWidget);
    position = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x5c,0,this,0);
    if (closable) {
      if ((this_00->tabList).d.size != 0) {
        uVar8 = 0;
        bVar4 = false;
        do {
          lVar7 = *(long *)&(this->super_QWidget).field_0x8;
          if (uVar8 < *(ulong *)(lVar7 + 0x2e8)) {
            lVar7 = *(long *)(*(long *)(lVar7 + 0x2e0) + uVar8 * 8);
          }
          else {
            lVar7 = 0;
          }
          if ((lVar7 == 0) || (*(long *)(lVar7 + (ulong)(position != LeftSide) * 8 + 200) == 0)) {
            widget = (QWidget *)operator_new(0x28);
            anon_unknown.dwarf_10d2268::CloseButton::CloseButton
                      ((CloseButton *)widget,&this->super_QWidget);
            local_48 = QAbstractButton::clicked;
            local_40 = 0;
            local_58 = QTabBarPrivate::closeTab;
            local_50 = (ImplFn)0x0;
            ppvVar1 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
            puVar6 = (undefined4 *)operator_new(0x20);
            *puVar6 = 1;
            *(code **)(puVar6 + 2) =
                 QtPrivate::QPrivateSlotObject<void_(QTabBarPrivate::*)(),_QtPrivate::List<>,_void>
                 ::impl;
            *(code **)(puVar6 + 4) = QTabBarPrivate::closeTab;
            *(undefined8 *)(puVar6 + 6) = 0;
            QObject::connectImpl
                      ((QObject *)&local_60,(void **)widget,(QObject *)&local_48,ppvVar1,
                       (QSlotObjectBase *)&local_58,(ConnectionType)puVar6,(int *)0x0,
                       (QMetaObject *)0x0);
            QMetaObject::Connection::~Connection(&local_60);
            setTabButton(this,(int)uVar8,position,widget);
            bVar4 = true;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(this_00->tabList).d.size);
        if (bVar4) {
          QTabBarPrivate::layoutTabs(this_00);
        }
      }
    }
    else {
      lVar7 = (this_00->tabList).d.size;
      if (lVar7 != 0) {
        ppTVar2 = (this_00->tabList).d.ptr;
        lVar9 = 0;
        do {
          lVar3 = *(long *)((long)ppTVar2 + lVar9);
          if (position == RightSide) {
            if (*(long *)(lVar3 + 0xd0) != 0) {
              QObject::deleteLater();
              *(undefined8 *)(lVar3 + 0xd0) = 0;
            }
          }
          else if ((position == LeftSide) && (*(long *)(lVar3 + 200) != 0)) {
            QObject::deleteLater();
            *(undefined8 *)(lVar3 + 200) = 0;
          }
          lVar9 = lVar9 + 8;
        } while (lVar7 << 3 != lVar9);
      }
    }
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::setTabsClosable(bool closable)
{
    Q_D(QTabBar);
    if (d->closeButtonOnTabs == closable)
        return;
    d->closeButtonOnTabs = closable;
    ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
    if (!closable) {
        for (auto tab : std::as_const(d->tabList)) {
            if (closeSide == LeftSide && tab->leftWidget) {
                tab->leftWidget->deleteLater();
                tab->leftWidget = nullptr;
            }
            if (closeSide == RightSide && tab->rightWidget) {
                tab->rightWidget->deleteLater();
                tab->rightWidget = nullptr;
            }
        }
    } else {
        bool newButtons = false;
        for (int i = 0; i < d->tabList.size(); ++i) {
            if (tabButton(i, closeSide))
                continue;
            newButtons = true;
            QAbstractButton *closeButton = new CloseButton(this);
            QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                    d, &QTabBarPrivate::closeTab);
            setTabButton(i, closeSide, closeButton);
        }
        if (newButtons)
            d->layoutTabs();
    }
    update();
}